

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O3

void __thiscall
duckdb::BatchedDataCollection::BatchedDataCollection
          (BatchedDataCollection *this,ClientContext *context_p,
          vector<duckdb::LogicalType,_true> *types_p,bool buffer_managed_p)

{
  _Rb_tree_header *p_Var1;
  pointer pLVar2;
  
  this->context = context_p;
  pLVar2 = (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar2;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->buffer_managed = buffer_managed_p;
  p_Var1 = &(this->data)._M_t._M_impl.super__Rb_tree_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->last_collection).batch_index = 0xffffffffffffffff;
  (this->last_collection).collection = (ColumnDataCollection *)0x0;
  (this->last_collection).append_state.current_chunk_state.handles._M_h._M_buckets =
       &(this->last_collection).append_state.current_chunk_state.handles._M_h._M_single_bucket;
  (this->last_collection).append_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->last_collection).append_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->last_collection).append_state.current_chunk_state.handles._M_h._M_element_count = 0;
  (this->last_collection).append_state.current_chunk_state.handles._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  (this->last_collection).append_state.current_chunk_state.handles._M_h._M_rehash_policy.
  _M_next_resize = 0;
  (this->last_collection).append_state.current_chunk_state.handles._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->last_collection).append_state.current_chunk_state.properties = INVALID;
  (this->last_collection).append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->last_collection).append_state.vector_data.
           super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
           super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->last_collection).append_state.vector_data.
           super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
           super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  return;
}

Assistant:

BatchedDataCollection::BatchedDataCollection(ClientContext &context_p, vector<LogicalType> types_p,
                                             bool buffer_managed_p)
    : context(context_p), types(std::move(types_p)), buffer_managed(buffer_managed_p) {
}